

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O0

int main(void)

{
  time1 func;
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ptime pVar4;
  ptime pVar5;
  ptime pVar6;
  ptime pVar7;
  ptime pVar8;
  exception *e;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  time2 exec2;
  time1 exec1;
  deadline_timer t2;
  io_service srv;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  ptime tmp;
  ptime now;
  deadline_timer timer;
  ptime *in_stack_ffffffffffffe778;
  ptime *in_stack_ffffffffffffe780;
  callback<void_(const_std::error_code_&)> *in_stack_ffffffffffffe798;
  time2 in_stack_ffffffffffffe7a0;
  io_service *in_stack_ffffffffffffe7a8;
  deadline_timer *in_stack_ffffffffffffe7b0;
  bool local_169e;
  bool local_1596;
  string local_14e0 [32];
  ostringstream local_14c0 [376];
  longlong local_1348;
  int local_1340;
  longlong local_1338;
  int local_1330;
  longlong local_1328;
  int local_1320;
  ptime local_1318;
  undefined1 local_1301;
  string local_1300 [32];
  ostringstream local_12e0 [376];
  longlong local_1168;
  int local_1160;
  longlong local_1158;
  int local_1150;
  longlong local_1148;
  int local_1140;
  longlong local_1138;
  int local_1130;
  undefined1 local_1121;
  string local_1120 [32];
  ostringstream local_1100 [376];
  io_service *local_f88;
  io_service *local_f78;
  deadline_timer *pdStack_f70;
  io_service *local_f60;
  io_service *local_f58;
  deadline_timer *pdStack_f50;
  longlong local_f48;
  int local_f40;
  longlong local_f38;
  int local_f30;
  longlong local_f28;
  int local_f20;
  longlong local_f18;
  int local_f10;
  undefined1 local_f08 [12];
  undefined1 local_ef8 [12];
  deadline_timer local_ee8 [40];
  io_service local_ec0 [23];
  undefined1 local_ea9;
  string local_ea8 [32];
  ostringstream local_e88 [376];
  longlong local_d10;
  int local_d08;
  ptime local_d00;
  undefined1 local_ce9;
  string local_ce8 [32];
  ostringstream local_cc8 [376];
  longlong local_b50;
  int local_b48;
  longlong local_b40;
  int local_b38;
  longlong local_b30;
  int local_b28;
  undefined1 local_b20 [12];
  undefined1 local_b10 [12];
  longlong local_b00;
  int local_af8;
  longlong local_af0;
  int local_ae8;
  longlong local_ae0;
  int local_ad8;
  undefined1 local_ad0 [12];
  undefined1 local_ac0 [12];
  undefined1 local_aa9;
  string local_aa8 [32];
  ostringstream local_a88 [376];
  longlong local_910;
  int local_908;
  longlong local_900;
  int local_8f8;
  longlong local_8f0;
  int local_8e8;
  longlong local_8e0;
  int local_8d8;
  undefined1 local_8d0 [12];
  undefined1 local_8c0 [12];
  undefined1 local_8a9;
  string local_8a8 [32];
  ostringstream local_888 [376];
  longlong local_710;
  int local_708;
  longlong local_700;
  int local_6f8;
  longlong local_6f0;
  int local_6e8;
  longlong local_6e0;
  int local_6d8;
  undefined1 local_6c9;
  string local_6c8 [32];
  ostringstream local_6a8 [376];
  longlong local_530;
  int local_528;
  longlong local_520;
  int local_518;
  longlong local_510;
  int local_508;
  longlong local_500;
  int local_4f8;
  undefined1 local_4f0 [12];
  undefined1 local_4e0 [12];
  longlong local_4d0;
  int local_4c8;
  longlong local_4c0;
  int local_4b8;
  undefined1 local_4a9;
  string local_4a8 [32];
  ostringstream local_488 [376];
  longlong local_310;
  int local_308;
  longlong local_300;
  int local_2f8;
  longlong local_2f0;
  int local_2e8;
  longlong local_2e0;
  int local_2d8;
  undefined1 local_2d0 [12];
  undefined1 local_2c0 [12];
  undefined1 local_2a9;
  string local_2a8 [32];
  ostringstream local_288 [376];
  longlong local_110;
  int local_108;
  longlong local_100;
  int local_f8;
  longlong local_f0;
  int local_e8;
  ptime local_e0;
  undefined1 local_d0 [12];
  undefined1 local_c0 [12];
  longlong local_b0;
  int local_a8;
  longlong local_a0;
  int local_98;
  longlong local_90;
  int local_88;
  longlong local_80;
  int local_78;
  undefined1 local_70 [12];
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  deadline_timer local_30 [44];
  undefined4 local_4;
  
  local_4 = 0;
  booster::aio::deadline_timer::deadline_timer(local_30);
  local_60 = booster::ptime::now();
  local_50 = local_60;
  booster::ptime::ptime(in_stack_ffffffffffffe780,(longlong)in_stack_ffffffffffffe778,0);
  pVar4 = booster::ptime::seconds(0x1034e0);
  local_a0 = pVar4.sec;
  local_98 = pVar4.nsec;
  local_90 = local_a0;
  local_88 = local_98;
  pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  local_b0 = pVar4.sec;
  local_a8 = pVar4.nsec;
  pVar4._8_8_ = local_b0;
  pVar4.sec = (longlong)local_30;
  local_80 = local_b0;
  local_78 = local_a8;
  booster::aio::deadline_timer::expires_at(pVar4);
  local_d0 = booster::aio::deadline_timer::expires_at();
  local_c0 = local_d0;
  pVar4 = booster::ptime::seconds(0x103613);
  local_100 = pVar4.sec;
  local_f8 = pVar4.nsec;
  local_f0 = local_100;
  local_e8 = local_f8;
  pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  local_110 = pVar4.sec;
  local_108 = pVar4.nsec;
  local_e0.sec = local_110;
  local_e0.nsec = local_108;
  bVar1 = booster::ptime::operator==((ptime *)local_c0,&local_e0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_288);
    poVar2 = std::operator<<((ostream *)local_288,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," timer.expires_at() == now + ptime::seconds(1)");
    local_2a9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2a8);
    local_2a9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2d0 = booster::aio::deadline_timer::expires_from_now();
  local_2c0 = local_2d0;
  local_70 = local_2d0;
  pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
  local_2f0 = pVar4.sec;
  local_2e8 = pVar4.nsec;
  local_2e0 = local_2f0;
  local_2d8 = local_2e8;
  bVar1 = booster::ptime::operator<=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  local_1596 = false;
  if (bVar1) {
    pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
    local_310 = pVar4.sec;
    local_308 = pVar4.nsec;
    local_300 = local_310;
    local_2f8 = local_308;
    local_1596 = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  }
  if (local_1596 == false) {
    std::__cxx11::ostringstream::ostringstream(local_488);
    poVar2 = std::operator<<((ostream *)local_488,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x33);
    std::operator<<(poVar2,
                    " (tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900)"
                   );
    local_4a9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4a8);
    local_4a9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
  local_4d0 = pVar4.sec;
  local_4c8 = pVar4.nsec;
  pVar5._8_8_ = local_4d0;
  pVar5.sec = (longlong)local_30;
  local_4c0 = local_4d0;
  local_4b8 = local_4c8;
  booster::aio::deadline_timer::expires_from_now(pVar5);
  local_4f0 = booster::aio::deadline_timer::expires_at();
  local_4e0 = local_4f0;
  local_70 = local_4f0;
  pVar4 = booster::ptime::seconds(0x103cc7);
  local_520 = pVar4.sec;
  local_518 = pVar4.nsec;
  local_510 = local_520;
  local_508 = local_518;
  pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  local_530 = pVar4.sec;
  local_528 = pVar4.nsec;
  local_500 = local_530;
  local_4f8 = local_528;
  bVar1 = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_6a8);
    poVar2 = std::operator<<((ostream *)local_6a8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
    std::operator<<(poVar2," (tmp = timer.expires_at()) >= now + ptime::seconds(2)");
    local_6c9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6c8);
    local_6c9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
  local_700 = pVar4.sec;
  local_6f8 = pVar4.nsec;
  local_6f0 = local_700;
  local_6e8 = local_6f8;
  pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  local_710 = pVar4.sec;
  local_708 = pVar4.nsec;
  local_6e0 = local_710;
  local_6d8 = local_708;
  bVar1 = booster::ptime::operator<=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
  if (bVar1) {
    local_8d0 = booster::aio::deadline_timer::expires_from_now();
    local_8c0 = local_8d0;
    local_70 = local_8d0;
    pVar4 = booster::ptime::seconds(0x10421f);
    local_8f0 = pVar4.sec;
    local_8e8 = pVar4.nsec;
    local_8e0 = local_8f0;
    local_8d8 = local_8e8;
    bVar1 = booster::ptime::operator<=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    local_169e = false;
    if (bVar1) {
      pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
      local_910 = pVar4.sec;
      local_908 = pVar4.nsec;
      local_900 = local_910;
      local_8f8 = local_908;
      local_169e = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    }
    if (local_169e == false) {
      std::__cxx11::ostringstream::ostringstream(local_a88);
      poVar2 = std::operator<<((ostream *)local_a88,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x37);
      std::operator<<(poVar2,
                      " (tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900)"
                     );
      local_aa9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_aa8);
      local_aa9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_ad0 = booster::ptime::now();
    local_ac0 = local_ad0;
    local_50 = local_ad0;
    pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
    local_af0 = pVar4.sec;
    local_ae8 = pVar4.nsec;
    pVar6._8_8_ = local_af0;
    pVar6.sec = (longlong)local_30;
    local_ae0 = local_af0;
    local_ad8 = local_ae8;
    booster::aio::deadline_timer::expires_from_now(pVar6);
    booster::aio::deadline_timer::wait();
    local_b20 = booster::ptime::now();
    local_b10 = local_b20;
    pVar4 = booster::ptime::operator-(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    local_b30 = pVar4.sec;
    local_b28 = pVar4.nsec;
    local_b00 = local_b30;
    local_af8 = local_b28;
    local_70._0_8_ = local_b30;
    local_70._8_4_ = local_b28;
    pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
    local_b50 = pVar4.sec;
    local_b48 = pVar4.nsec;
    local_b40 = local_b50;
    local_b38 = local_b48;
    bVar1 = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_cc8);
      poVar2 = std::operator<<((ostream *)local_cc8,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3c);
      std::operator<<(poVar2," (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100)");
      local_ce9 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_ce8);
      local_ce9 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
    local_d10 = pVar4.sec;
    local_d08 = pVar4.nsec;
    local_d00.sec = local_d10;
    local_d00.nsec = local_d08;
    bVar1 = booster::ptime::operator<((ptime *)local_70,&local_d00);
    if (bVar1) {
      booster::aio::io_service::io_service(local_ec0);
      booster::aio::deadline_timer::set_io_service((io_service *)local_30);
      booster::aio::deadline_timer::deadline_timer(local_ee8,local_ec0);
      local_f08 = booster::ptime::now();
      local_ef8 = local_f08;
      local_50 = local_f08;
      pVar4 = booster::ptime::seconds(0x104b59);
      local_f28 = pVar4.sec;
      local_f20 = pVar4.nsec;
      pVar7._8_8_ = local_f28;
      pVar7.sec = (longlong)local_ee8;
      local_f18 = local_f28;
      local_f10 = local_f20;
      booster::aio::deadline_timer::expires_from_now(pVar7);
      pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
      local_f48 = pVar4.sec;
      local_f40 = pVar4.nsec;
      pVar8._8_8_ = local_f48;
      pVar8.sec = (longlong)local_30;
      local_f38 = local_f48;
      local_f30 = local_f40;
      booster::aio::deadline_timer::expires_from_now(pVar8);
      local_f78 = local_ec0;
      pdStack_f70 = local_ee8;
      func.timer2 = in_stack_ffffffffffffe7b0;
      func.srv = in_stack_ffffffffffffe7a8;
      local_f60 = local_f78;
      local_f58 = local_f78;
      pdStack_f50 = pdStack_f70;
      booster::callback<void_(const_std::error_code_&)>::callback<time1>
                ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffe7a0.srv,func);
      booster::aio::deadline_timer::async_wait((callback *)local_30);
      booster::callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x104cb4);
      local_f88 = local_f60;
      booster::callback<void_(const_std::error_code_&)>::callback<time2>
                (in_stack_ffffffffffffe798,in_stack_ffffffffffffe7a0);
      booster::aio::deadline_timer::async_wait((callback *)local_ee8);
      booster::callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x104cff);
      booster::aio::io_service::run();
      bVar1 = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1100);
        poVar2 = std::operator<<((ostream *)local_1100,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4d);
        std::operator<<(poVar2," occured2_at >= occured1_at");
        local_1121 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_1120);
        local_1121 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
      local_1158 = pVar4.sec;
      local_1150 = pVar4.nsec;
      local_1148 = local_1158;
      local_1140 = local_1150;
      pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
      local_1168 = pVar4.sec;
      local_1160 = pVar4.nsec;
      local_1138 = local_1168;
      local_1130 = local_1160;
      bVar1 = booster::ptime::operator>=(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
      if (bVar1) {
        pVar4 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffffe780);
        local_1338 = pVar4.sec;
        local_1330 = pVar4.nsec;
        local_1328 = local_1338;
        local_1320 = local_1330;
        pVar4 = booster::ptime::operator+(in_stack_ffffffffffffe780,in_stack_ffffffffffffe778);
        local_1348 = pVar4.sec;
        local_1340 = pVar4.nsec;
        local_1318.sec = local_1348;
        local_1318.nsec = local_1340;
        bVar1 = booster::ptime::operator<(&occured2_at,&local_1318);
        if (bVar1) {
          booster::aio::deadline_timer::~deadline_timer(local_ee8);
          booster::aio::io_service::~io_service(local_ec0);
          booster::aio::deadline_timer::~deadline_timer(local_30);
          poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          return 0;
        }
        std::__cxx11::ostringstream::ostringstream(local_14c0);
        poVar2 = std::operator<<((ostream *)local_14c0,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4f);
        std::operator<<(poVar2," occured2_at < now + ptime::milliseconds(300)");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::runtime_error::runtime_error(prVar3,local_14e0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream(local_12e0);
      poVar2 = std::operator<<((ostream *)local_12e0,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4e);
      std::operator<<(poVar2," occured1_at >= now + ptime::milliseconds(100)");
      local_1301 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar3,local_1300);
      local_1301 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream(local_e88);
    poVar2 = std::operator<<((ostream *)local_e88,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3d);
    std::operator<<(poVar2," tmp < ptime::milliseconds(300)");
    local_ea9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_ea8);
    local_ea9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_888);
  poVar2 = std::operator<<((ostream *)local_888,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x36);
  std::operator<<(poVar2," tmp <= now + ptime::milliseconds(2100)");
  local_8a9 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_8a8);
  local_8a9 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;
		booster::aio::deadline_timer timer;
		booster::ptime now=booster::ptime::now(),tmp;
		timer.expires_at(now + ptime::seconds(1));
		TEST(timer.expires_at() == now + ptime::seconds(1));
		TEST((tmp = timer.expires_from_now()) <= ptime::milliseconds(1000) && tmp >=ptime::milliseconds(900));
		timer.expires_from_now(ptime::milliseconds(2000));
		TEST((tmp = timer.expires_at()) >= now + ptime::seconds(2));
		TEST(tmp <= now + ptime::milliseconds(2100));
		TEST((tmp = timer.expires_from_now()) <= ptime::seconds(2) && tmp >= ptime::milliseconds(1900));
		
		now = booster::ptime::now();
		timer.expires_from_now(ptime::milliseconds(100));
		timer.wait();
		TEST( (tmp = (booster::ptime::now() - now)) >= ptime::milliseconds(100));
		TEST( tmp < ptime::milliseconds(300));

		booster::aio::io_service srv;
		timer.set_io_service(srv);
		booster::aio::deadline_timer t2(srv);
		
		now = booster::ptime::now();


		t2.expires_from_now(ptime::seconds(2));
		timer.expires_from_now(ptime::milliseconds(100));
		time1 exec1 = { &srv, &t2 };
		time2 exec2 = { &srv };
		timer.async_wait(exec1);
		t2.async_wait(exec2);
		srv.run();
		TEST(occured2_at >= occured1_at);
		TEST(occured1_at >= now + ptime::milliseconds(100));
		TEST(occured2_at < now + ptime::milliseconds(300));
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail: " <<e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}